

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int __thiscall MlmWrap::addHfTypeToSubbedList(MlmWrap *this,HFSubSockSettings *socketInfo)

{
  byte bVar1;
  value_type *in_RSI;
  vector<HFSubSockSettings,_std::allocator<HFSubSockSettings>_> *in_RDI;
  string *unaff_retaddr;
  MlmWrap *in_stack_00000008;
  HighFreqDataType nData;
  HighFreqDataType *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  HighFreqDataType *in_stack_ffffffffffffff08;
  HighFreqDataType *in_stack_ffffffffffffff10;
  string local_c8 [192];
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  HighFreqDataType::HighFreqDataType(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  HighFreqDataType::getName_abi_cxx11_(in_stack_fffffffffffffed8);
  HighFreqDataType::getOrigin_abi_cxx11_(in_stack_fffffffffffffed8);
  bVar1 = isHfTypeCurrentlySubbed
                    (in_stack_00000008,unaff_retaddr,
                     (string *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
  std::__cxx11::string::~string(local_c8);
  if ((bVar1 & 1) == 0) {
    std::vector<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>::push_back(in_RDI,in_RSI);
    iVar2 = 0;
  }
  else {
    iVar2 = -1;
  }
  HighFreqDataType::~HighFreqDataType((HighFreqDataType *)CONCAT17(bVar1,in_stack_fffffffffffffee0))
  ;
  return iVar2;
}

Assistant:

int MlmWrap::addHfTypeToSubbedList(HFSubSockSettings socketInfo) {
    HighFreqDataType nData = socketInfo.dataType;
    if (isHfTypeCurrentlySubbed(nData.getName(), nData.getOrigin()))
        return(-1);
    subbedHfDataTypes.push_back(socketInfo);
    return(0);
}